

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

int __thiscall
ctemplate::TemplateCache::Refcount(TemplateCache *this,TemplateCacheKey template_cache_key)

{
  Mutex *this_00;
  int iVar1;
  second_type *psVar2;
  undefined8 in_RCX;
  pair<unsigned_long,_int> v;
  
  this_00 = this->mutex_;
  Mutex::ReaderLock(this_00);
  v.first = (ulong)(uint)template_cache_key.second;
  v._8_8_ = in_RCX;
  psVar2 = find_ptr<std::unordered_map<std::pair<unsigned_long,int>,ctemplate::TemplateCache::CachedTemplate,ctemplate::TemplateCache::TemplateCacheHash,std::equal_to<std::pair<unsigned_long,int>>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>>,std::pair<unsigned_long,int>>
                     ((ctemplate *)this->parsed_template_cache_,
                      (unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
                       *)template_cache_key.first,v);
  if (psVar2 == (second_type *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = RefcountedTemplate::refcount(psVar2->refcounted_tpl);
  }
  Mutex::ReaderUnlock(this_00);
  return iVar1;
}

Assistant:

int TemplateCache::Refcount(const TemplateCacheKey template_cache_key) const {
  ReaderMutexLock ml(mutex_);
  CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
  return it ? it->refcounted_tpl->refcount() : 0;
}